

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_sllq(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGLabel *l;
  TCGLabel *a1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_ppc64(s);
  a1 = gen_new_label_ppc64(s);
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,true);
  ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,true);
  ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,true);
  tcg_gen_andi_i64_ppc64
            (s,(TCGv_i64)((long)ts_01 - (long)s),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),0x1f);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)ts_00,0xffffffff);
  tcg_gen_op3_ppc64(s,INDEX_op_shl_i64,(TCGArg)ts_00,(TCGArg)ts_00,(TCGArg)ts_01);
  tcg_gen_andi_i64_ppc64
            (s,(TCGv_i64)((long)ts - (long)s),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),0x20);
  tcg_gen_brcondi_i64_ppc64(s,TCG_COND_EQ,(TCGv_i64)((long)ts - (long)s),0,l);
  tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0xb18);
  tcg_gen_op3_ppc64(s,INDEX_op_and_i64,
                    (TCGArg)((long)&s->pool_cur +
                            (long)cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]),(TCGArg)ts,
                    (TCGArg)ts_00);
  *(short *)&a1->field_0x2 = (short)((uint)*(ushort *)&a1->field_0x2 * 0x10000 + 0x10000 >> 0x10);
  tcg_gen_op1_ppc64(s,INDEX_op_br,(TCGArg)a1);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)l);
  tcg_gen_op3_ppc64(s,INDEX_op_shl_i64,(TCGArg)ts,
                    (long)&s->pool_cur +
                    *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),(TCGArg)ts_01);
  tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_01,(TCGArg)(s->cpu_env + (long)s),0xb18);
  tcg_gen_andc_i64_ppc64
            (s,(TCGv_i64)((long)ts_00 - (long)s),(TCGv_i64)((long)ts_01 - (long)s),
             (TCGv_i64)((long)ts_00 - (long)s));
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,
                    (TCGArg)((long)&s->pool_cur +
                            (long)cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]),(TCGArg)ts,
                    (TCGArg)ts_00);
  *(byte *)a1 = *(byte *)a1 | 1;
  tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)a1);
  tcg_temp_free_internal_ppc64(s,ts);
  tcg_temp_free_internal_ppc64(s,ts_00);
  tcg_temp_free_internal_ppc64(s,ts_01);
  if ((ctx->opcode & 1) != 0) {
    gen_sllq_cold_1();
  }
  return;
}

Assistant:

static void gen_sllq(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);
    TCGv t0 = tcg_temp_local_new(tcg_ctx);
    TCGv t1 = tcg_temp_local_new(tcg_ctx);
    TCGv t2 = tcg_temp_local_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, t2, cpu_gpr[rB(ctx->opcode)], 0x1F);
    tcg_gen_movi_tl(tcg_ctx, t1, 0xFFFFFFFF);
    tcg_gen_shl_tl(tcg_ctx, t1, t1, t2);
    tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rB(ctx->opcode)], 0x20);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t0, 0, l1);
    gen_load_spr(tcg_ctx, t0, SPR_MQ);
    tcg_gen_and_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0, t1);
    tcg_gen_br(tcg_ctx, l2);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_shl_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], t2);
    gen_load_spr(tcg_ctx, t2, SPR_MQ);
    tcg_gen_andc_tl(tcg_ctx, t1, t2, t1);
    tcg_gen_or_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0, t1);
    gen_set_label(tcg_ctx, l2);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}